

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall PFData::emplaceSubgridFromFile(PFData *this,FILE *fp,int gridZ,int gridY,int gridX)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  void *__ptr;
  size_t sVar10;
  int *piVar11;
  uint64_t uVar12;
  FILE *in_RSI;
  long in_RDI;
  uint64_t tmp;
  size_t i;
  size_t numRead;
  double *dataPtr;
  longlong index;
  int y;
  int z;
  longlong startOfGrid;
  int startX;
  int startY;
  int startZ;
  int sizeX;
  int sizeY;
  int sizeZ;
  long offset;
  undefined8 in_stack_ffffffffffffff88;
  int iVar14;
  ulong uVar13;
  PFData *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  PFData *in_stack_ffffffffffffffa0;
  int local_58;
  int local_54;
  
  lVar9 = getSubgridOffset(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                           ,(int)in_stack_ffffffffffffff98,
                           (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  fseek(in_RSI,lVar9 + 0x24,0);
  iVar14 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  iVar3 = getSubgridSizeZ(in_stack_ffffffffffffff90,iVar14);
  iVar4 = getSubgridSizeY(in_stack_ffffffffffffff90,iVar14);
  iVar5 = getSubgridSizeX(in_stack_ffffffffffffff90,iVar14);
  iVar6 = getSubgridStartZ(in_stack_ffffffffffffff90,iVar14);
  iVar7 = getSubgridStartY(in_stack_ffffffffffffff90,iVar14);
  iVar8 = getSubgridStartX(in_stack_ffffffffffffff90,iVar14);
  iVar14 = *(int *)(in_RDI + 0x48);
  iVar1 = *(int *)(in_RDI + 0x44);
  iVar2 = *(int *)(in_RDI + 0x48);
  local_54 = 0;
  do {
    if (iVar3 <= local_54) {
      return 0;
    }
    for (local_58 = 0; local_58 < iVar4; local_58 = local_58 + 1) {
      __ptr = (void *)(*(long *)(in_RDI + 0xa0) +
                      ((long)(iVar6 * iVar14 * iVar1 + iVar7 * iVar2 + iVar8) +
                       (long)(local_54 * *(int *)(in_RDI + 0x48) * *(int *)(in_RDI + 0x44)) +
                      (long)(local_58 * *(int *)(in_RDI + 0x48))) * 8);
      sVar10 = fread(__ptr,8,(long)iVar5,in_RSI);
      if (sVar10 != (long)iVar5) {
        piVar11 = __errno_location();
        return *piVar11;
      }
      for (uVar13 = 0; uVar13 < (ulong)(long)iVar5; uVar13 = uVar13 + 1) {
        uVar12 = bswap64(*(uint64_t *)((long)__ptr + uVar13 * 8));
        *(uint64_t *)((long)__ptr + uVar13 * 8) = uVar12;
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

int PFData::emplaceSubgridFromFile(std::FILE* fp, int gridZ, int gridY, int gridX){
    //Position file
    const long offset = getSubgridOffset(gridZ, gridY, gridX) + 36;
    std::fseek(fp, offset, SEEK_SET);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const int startZ = getSubgridStartZ(gridZ);
    const int startY = getSubgridStartY(gridY);
    const int startX = getSubgridStartX(gridX);

    //The index into m_data where the first element of the grid belongs.
    const long long startOfGrid = startZ*m_nx*m_ny + startY * m_nx + startX;

    for(int z = 0; z < sizeZ; ++z){
        for(int y = 0; y < sizeY; ++y){
            const long long index = startOfGrid + z * m_nx * m_ny + y * m_nx;
            double* const dataPtr = &(m_data[index]);

            const std::size_t numRead = std::fread(dataPtr, 8, sizeX, fp);
            if(numRead != static_cast<std::size_t>(sizeX)){
                return errno;
            }

            //Perform endian byte swap
            for(std::size_t i = 0; i < sizeX; ++i){
                uint64_t tmp = *reinterpret_cast<uint64_t*>(&dataPtr[i]);
                tmp = bswap64(tmp);
                dataPtr[i] = *reinterpret_cast<double*>(&tmp);
            }
        }
    }

    return 0;
}